

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validationinterface_tests.cpp
# Opt level: O1

void __thiscall
validationinterface_tests::unregister_all_during_call::test_method(unregister_all_during_call *this)

{
  ValidationSignals *pVVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  iterator in_R8;
  iterator pvVar2;
  iterator in_R9;
  iterator pvVar3;
  long in_FS_OFFSET;
  shared_ptr<CValidationInterface> callbacks;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  bool destroyed;
  check_type cVar4;
  char *local_158;
  char *local_150;
  undefined1 *local_148;
  undefined1 *local_140;
  char *local_138;
  char *local_130;
  char *local_128;
  char *local_120;
  undefined1 *local_118;
  undefined1 *local_110;
  char *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  undefined1 *local_e8;
  undefined1 *local_e0;
  char *local_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  char *local_b0;
  assertion_result local_a8;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  element_type local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  readonly_property<bool> local_59;
  undefined1 local_58 [16];
  undefined1 *local_48;
  char **ppcStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_59.super_class_property<bool>.value = (class_property<bool>)false;
  pVVar1 = (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_BasicTestingSetup.m_node.
           validation_signals._M_t.
           super___uniq_ptr_impl<ValidationSignals,_std::default_delete<ValidationSignals>_>._M_t.
           super__Tuple_impl<0UL,_ValidationSignals_*,_std::default_delete<ValidationSignals>_>.
           super__Head_base<0UL,_ValidationSignals_*,_false>._M_head_impl;
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x60);
  this_00->_M_use_count = 1;
  this_00->_M_weak_count = 1;
  this_00->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_013b1b28;
  this_00[1]._vptr__Sp_counted_base = (_func_int **)&PTR_UpdatedBlockTip_013b1b78;
  this_00[3]._vptr__Sp_counted_base =
       (_func_int **)
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validationinterface_tests.cpp:86:9)>
       ::_M_invoke;
  *(unregister_all_during_call **)&this_00[1]._M_use_count = this;
  this_00[2]._vptr__Sp_counted_base = (_func_int **)&local_59;
  *(code **)&this_00[2]._M_use_count =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validationinterface_tests.cpp:86:9)>
       ::_M_manager;
  this_00[3]._M_use_count = 0;
  this_00[3]._M_weak_count = 0;
  this_00[4]._vptr__Sp_counted_base = (_func_int **)0x0;
  this_00[5]._vptr__Sp_counted_base =
       (_func_int **)
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validationinterface_tests.cpp:94:9)>
       ::_M_invoke;
  *(readonly_property<bool> **)&this_00[3]._M_use_count = &local_59;
  this_00[4]._vptr__Sp_counted_base = (_func_int **)0x0;
  *(code **)&this_00[4]._M_use_count =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validationinterface_tests.cpp:94:9)>
       ::_M_manager;
  *(ValidationSignals **)&this_00[5]._M_use_count = pVVar1;
  ppcStack_40 = (char **)0x0;
  local_48 = (undefined1 *)0x0;
  pVVar1 = (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_BasicTestingSetup.m_node.
           validation_signals._M_t.
           super___uniq_ptr_impl<ValidationSignals,_std::default_delete<ValidationSignals>_>._M_t.
           super__Tuple_impl<0UL,_ValidationSignals_*,_std::default_delete<ValidationSignals>_>.
           super__Head_base<0UL,_ValidationSignals_*,_false>._M_head_impl;
  if (__libc_single_threaded == '\0') {
    LOCK();
    this_00->_M_use_count = this_00->_M_use_count + 1;
    UNLOCK();
  }
  else {
    this_00->_M_use_count = this_00->_M_use_count + 1;
  }
  callbacks.super___shared_ptr<CValidationInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&PTR_UpdatedBlockTip_013b1b78;
  callbacks.super___shared_ptr<CValidationInterface,_(__gnu_cxx::_Lock_policy)2>._M_ptr = &local_70;
  local_70._vptr_CValidationInterface = (_func_int **)(this_00 + 1);
  local_68 = this_00;
  local_58._0_8_ = this;
  local_58._8_8_ = &local_59;
  ValidationSignals::RegisterSharedValidationInterface(pVVar1,callbacks);
  if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
  }
  local_80 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validationinterface_tests.cpp"
  ;
  local_78 = "";
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x60;
  file.m_begin = (iterator)&local_80;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_90,msg);
  local_a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(this_00->_M_use_count == 2);
  local_a8.m_message.px = (element_type *)0x0;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_b8 = "shared.use_count() == 2";
  local_b0 = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013abc70;
  local_48 = boost::unit_test::lazy_ostream::inst;
  local_c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validationinterface_tests.cpp"
  ;
  local_c0 = "";
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x0;
  ppcStack_40 = &local_b8;
  boost::test_tools::tt_detail::report_assertion
            (&local_a8,(lazy_ostream *)local_58,1,0,WARN,_cVar4,(size_t)&local_c8,0x60);
  boost::detail::shared_count::~shared_count(&local_a8.m_message.pn);
  TestInterface::Call((TestInterface *)(this_00 + 1));
  local_d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validationinterface_tests.cpp"
  ;
  local_d0 = "";
  local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x62;
  file_00.m_begin = (iterator)&local_d8;
  msg_00.m_end = pvVar3;
  msg_00.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_e8,msg_00
            );
  local_a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(this_00->_M_use_count == 1);
  local_a8.m_message.px = (element_type *)0x0;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_b8 = "shared.use_count() == 1";
  local_b0 = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013abc70;
  local_48 = boost::unit_test::lazy_ostream::inst;
  local_f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validationinterface_tests.cpp"
  ;
  local_f0 = "";
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x0;
  ppcStack_40 = &local_b8;
  boost::test_tools::tt_detail::report_assertion
            (&local_a8,(lazy_ostream *)local_58,1,0,WARN,_cVar4,(size_t)&local_f8,0x62);
  boost::detail::shared_count::~shared_count(&local_a8.m_message.pn);
  local_108 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validationinterface_tests.cpp"
  ;
  local_100 = "";
  local_118 = &boost::unit_test::basic_cstring<char_const>::null;
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x63;
  file_01.m_begin = (iterator)&local_108;
  msg_01.m_end = pvVar3;
  msg_01.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_118,
             msg_01);
  local_a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((byte)local_59.super_class_property<bool>.value ^ 1);
  local_a8.m_message.px = (element_type *)0x0;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_b8 = "!destroyed";
  local_b0 = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013abc70;
  local_48 = boost::unit_test::lazy_ostream::inst;
  local_128 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validationinterface_tests.cpp"
  ;
  local_120 = "";
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x0;
  ppcStack_40 = &local_b8;
  boost::test_tools::tt_detail::report_assertion
            (&local_a8,(lazy_ostream *)local_58,1,0,WARN,_cVar4,(size_t)&local_128,99);
  boost::detail::shared_count::~shared_count(&local_a8.m_message.pn);
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  local_138 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validationinterface_tests.cpp"
  ;
  local_130 = "";
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x65;
  file_02.m_begin = (iterator)&local_138;
  msg_02.m_end = pvVar3;
  msg_02.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_148,
             msg_02);
  local_a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)local_59.super_class_property<bool>.value;
  local_a8.m_message.px = (element_type *)0x0;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_b8 = "destroyed";
  local_b0 = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013abc70;
  local_48 = boost::unit_test::lazy_ostream::inst;
  local_158 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validationinterface_tests.cpp"
  ;
  local_150 = "";
  ppcStack_40 = &local_b8;
  boost::test_tools::tt_detail::report_assertion
            (&local_a8,(lazy_ostream *)local_58,1,0,WARN,_cVar4,(size_t)&local_158,0x65);
  boost::detail::shared_count::~shared_count(&local_a8.m_message.pn);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(unregister_all_during_call)
{
    bool destroyed = false;
    auto shared{std::make_shared<TestInterface>(
        *m_node.validation_signals,
        [&] {
            // First call should decrements reference count 2 -> 1
            m_node.validation_signals->UnregisterAllValidationInterfaces();
            BOOST_CHECK(!destroyed);
            // Second call should not decrement reference count 1 -> 0
            m_node.validation_signals->UnregisterAllValidationInterfaces();
            BOOST_CHECK(!destroyed);
        },
        [&] { destroyed = true; })};
    m_node.validation_signals->RegisterSharedValidationInterface(shared);
    BOOST_CHECK(shared.use_count() == 2);
    shared->Call();
    BOOST_CHECK(shared.use_count() == 1);
    BOOST_CHECK(!destroyed);
    shared.reset();
    BOOST_CHECK(destroyed);
}